

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
pbrt::GBufferFilm::AddSplat
          (GBufferFilm *this,Point2f *p,SampledSpectrum v,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  float fVar2;
  Point2i p_00;
  bool bVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  ulong uVar5;
  Pixel *pPVar6;
  int iVar7;
  int iVar8;
  int i;
  long lVar9;
  Bounds2<int> *pBVar10;
  AtomicDouble *this_00;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  Float FVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar19 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  float fVar24;
  undefined1 auVar25 [16];
  SampledSpectrum SVar26;
  RGB RVar27;
  Bounds2iIterator BVar28;
  initializer_list<float> __l;
  Bounds2iIterator __begin1;
  undefined8 local_80;
  undefined1 local_78 [16];
  SampledSpectrum v_local;
  Bounds2<int> local_50;
  SampledSpectrum H;
  
  local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y = local_50.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  auVar22._8_56_ = v._16_56_;
  auVar22._0_8_ = v.values.values._8_8_;
  auVar16._8_56_ = v._8_56_;
  auVar16._0_8_ = v.values.values._0_8_;
  v_local.values.values = (array<float,_4>)vmovlhps_avx(auVar16._0_16_,auVar22._0_16_);
  bVar3 = SampledSpectrum::HasNaNs(&v_local);
  if (!bVar3) {
    auVar19 = (undefined1  [56])0x0;
    SVar26 = SampledSpectrum::operator*(&v_local,((this->super_FilmBase).sensor)->imagingRatio);
    auVar23._0_8_ = SVar26.values.values._8_8_;
    auVar23._8_56_ = auVar22._8_56_;
    auVar17._0_8_ = SVar26.values.values._0_8_;
    auVar17._8_56_ = auVar19;
    H.values.values = (array<float,_4>)vmovlhps_avx(auVar17._0_16_,auVar23._0_16_);
    auVar22._8_56_ = ZEXT856(H.values.values._8_8_);
    RVar27 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&H,lambda);
    fVar20 = RVar27.b;
    auVar18._0_8_ = RVar27._0_8_;
    auVar18._8_56_ = auVar22._8_56_;
    uVar1 = vmovlps_avx(auVar18._0_16_);
    local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x = (int)fVar20;
    local_50.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar1;
    local_50.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)((ulong)uVar1 >> 0x20);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_50;
    fVar12 = std::max<float>(__l);
    fVar13 = this->maxComponentValue / fVar12;
    auVar11 = vmovshdup_avx(auVar18._0_16_);
    bVar3 = this->maxComponentValue < fVar12;
    local_78._4_12_ = auVar11._4_12_;
    local_78._0_4_ = (uint)bVar3 * (int)(auVar11._0_4_ * fVar13) + (uint)!bVar3 * (int)auVar11._0_4_
    ;
    uVar5 = *(ulong *)((this->super_FilmBase).filter.
                       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                       .bits & 0xffffffffffff);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar5;
    fVar12 = (p->super_Tuple2<pbrt::Point2,_float>).x + 0.5;
    fVar2 = (p->super_Tuple2<pbrt::Point2,_float>).y + 0.5;
    auVar11 = vmovshdup_avx(auVar11);
    fVar24 = (float)uVar5;
    auVar25 = ZEXT416((uint)(fVar12 - fVar24));
    auVar25 = vroundss_avx(auVar25,auVar25,9);
    auVar15 = ZEXT416((uint)(fVar2 - auVar11._0_4_));
    auVar15 = vroundss_avx(auVar15,auVar15,9);
    auVar21 = ZEXT416((uint)(fVar12 + fVar24));
    auVar21 = vroundss_avx(auVar21,auVar21,9);
    auVar11 = ZEXT416((uint)(fVar2 + auVar11._0_4_));
    auVar11 = vroundss_avx(auVar11,auVar11,9);
    iVar7 = (int)auVar25._0_4_;
    iVar8 = (int)auVar15._0_4_;
    local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x = (int)auVar21._0_4_ + 1;
    local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y = (int)auVar11._0_4_ + 1;
    local_50.pMin.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
    if (local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x < iVar7) {
      local_50.pMin.super_Tuple2<pbrt::Point2,_int>.x =
           local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x;
    }
    local_50.pMin.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
    if (local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar8) {
      local_50.pMin.super_Tuple2<pbrt::Point2,_int>.y =
           local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    }
    if (local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x < iVar7) {
      local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
    }
    if (local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar8) {
      local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
    }
    local_50 = Intersect<int>(&local_50,&(this->super_FilmBase).pixelBounds);
    TVar4 = (Tuple2<pbrt::Point2,_int>)local_50.pMin.super_Tuple2<pbrt::Point2,_int>;
    __begin1.p.super_Tuple2<pbrt::Point2,_int> = TVar4;
    __begin1.bounds = &local_50;
    BVar28 = pbrt::end(&local_50);
    uVar5 = (ulong)TVar4 >> 0x20;
    pBVar10 = &local_50;
    while (((p_00.super_Tuple2<pbrt::Point2,_int> = __begin1.p.super_Tuple2<pbrt::Point2,_int>,
            TVar4.x != BVar28.p.super_Tuple2<pbrt::Point2,_int>.x ||
            ((int)uVar5 != BVar28.p.super_Tuple2<pbrt::Point2,_int>.y)) ||
           (pBVar10 != BVar28.bounds))) {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
      auVar15._8_8_ = 0;
      auVar15._0_4_ = __begin1.p.super_Tuple2<pbrt::Point2,_int>.x;
      auVar15._4_4_ = __begin1.p.super_Tuple2<pbrt::Point2,_int>.y;
      auVar11 = vcvtdq2ps_avx(auVar15);
      auVar11 = vsubps_avx(auVar21,auVar11);
      auVar25._8_4_ = 0xbf000000;
      auVar25._0_8_ = 0xbf000000bf000000;
      auVar25._12_4_ = 0xbf000000;
      auVar11 = vaddps_avx512vl(auVar11,auVar25);
      local_80 = vmovlps_avx(auVar11);
      FVar14 = TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
               ::
               Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                           *)&(this->super_FilmBase).filter,(Point2f *)&local_80);
      if ((FVar14 != 0.0) || (NAN(FVar14))) {
        pPVar6 = Array2D<pbrt::GBufferFilm::Pixel>::operator[](&this->pixels,p_00);
        this_00 = pPVar6->splatRGB;
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          fVar12 = (float)((uint)bVar3 * (int)(RVar27.r * fVar13) + (uint)!bVar3 * (int)RVar27.r);
          if (((int)lVar9 != 0) && (fVar12 = (float)local_78._0_4_, (int)lVar9 != 1)) {
            fVar12 = (float)((uint)bVar3 * (int)(fVar20 * fVar13) + (uint)!bVar3 * (int)fVar20);
          }
          AtomicDouble::Add(this_00,(double)(fVar12 * FVar14));
          this_00 = this_00 + 1;
        }
      }
      Bounds2iIterator::operator++(&__begin1);
      TVar4 = __begin1.p.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
      uVar5 = (ulong)__begin1.p.super_Tuple2<pbrt::Point2,_int> >> 0x20;
      pBVar10 = __begin1.bounds;
    }
    return;
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,0x286,"Check failed: %s",(char (*) [13])"!v.HasNaNs()");
}

Assistant:

void GBufferFilm::AddSplat(const Point2f &p, SampledSpectrum v,
                           const SampledWavelengths &lambda) {
    // NOTE: same code as RGBFilm::AddSplat()...
    CHECK(!v.HasNaNs());
    // First convert to sensor exposure, H, then to camera RGB
    SampledSpectrum H = v * sensor->ImagingRatio();
    RGB rgb = sensor->ToSensorRGB(H, lambda);
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue)
        rgb *= maxComponentValue / m;

    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - filter.Radius())),
                         Point2i(Floor(pDiscrete + filter.Radius())) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);
    for (Point2i pi : splatBounds) {
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}